

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

void __thiscall t_d_generator::generate_typedef(t_d_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ttype;
  string local_60;
  string local_40;
  
  emit_doc(this,(t_doc *)ttypedef,(ostream *)&this->f_types_);
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_,local_40._M_dataplus._M_p,local_40._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"alias ",6);
  ttype = t_typedef::get_type(ttypedef);
  render_type_name_abi_cxx11_(&local_60,this,ttype,false);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(ttypedef->symbolic_)._M_dataplus._M_p,
                      (ttypedef->symbolic_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void generate_typedef(t_typedef* ttypedef) override {
    this->emit_doc(ttypedef, f_types_);
    f_types_ << indent() << "alias " << render_type_name(ttypedef->get_type()) << " "
             << ttypedef->get_symbolic() << ";" << endl << endl;
  }